

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_extract_component_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,uint32_t index)

{
  bool bVar1;
  char **in_R8;
  char (*in_R9) [2];
  string expr;
  uint32_t local_44;
  string local_40;
  char *local_20;
  
  local_44 = index;
  to_enclosed_expression_abi_cxx11_(&local_40,this,id,true);
  bVar1 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
  if (bVar1) {
    join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5810,
               (char (*) [2])&local_44,(uint *)0x3f5e45,in_R9);
  }
  else {
    if (local_44 - 1 < 3) {
      local_20 = *(char **)(&DAT_0050bf38 + (ulong)(local_44 - 1) * 8);
    }
    else {
      local_20 = "x";
    }
    join<std::__cxx11::string&,char_const(&)[2],char_const*>
              (__return_storage_ptr__,(spirv_cross *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3be36f,
               (char (*) [2])&local_20,in_R8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_extract_component_expression(uint32_t id, uint32_t index)
{
	auto expr = to_enclosed_expression(id);
	if (has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked))
		return join(expr, "[", index, "]");
	else
		return join(expr, ".", index_to_swizzle(index));
}